

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArYieldResult * __thiscall
NEST::LArNEST::GetdEdxYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double dx,
          double efield,double density)

{
  double dVar1;
  double ionization_yields;
  
  dVar1 = GetCanonicalIonizationYields(this,energy);
  ionization_yields = 0.0;
  if (0.0 <= dVar1) {
    ionization_yields = dVar1;
  }
  GetdEdxRecombinationYields
            (__return_storage_ptr__,this,ionization_yields,this->fNexOverNion * ionization_yields,
             energy,dx,efield);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetdEdxYields(double energy, double dx, double efield,
                                      double density) {
  LArYieldResult result;
  double ionization_yields = GetCanonicalIonizationYields(energy);
  if (ionization_yields < 0.0) {
    ionization_yields = 0.0;
  }
  double exciton_yields = fNexOverNion * ionization_yields;
  return GetdEdxRecombinationYields(ionization_yields, exciton_yields, energy,
                                    dx, efield);
}